

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> * __thiscall
Js::PathTypeHandlerBase::
ConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>>
          (PathTypeHandlerBase *this,DynamicObject *instance,int propertyCapacity,
          bool mayBecomeShared)

{
  byte bVar1;
  ScriptContext *scriptContext;
  Recycler *this_00;
  DynamicType *oldType;
  TypePath *pTVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  bool usedAsFixed;
  PropertyTypes values;
  int iVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  DynamicTypeHandler *pDVar9;
  PathTypeHandlerBase *this_01;
  Recycler *alloc;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_02;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  RecyclerWeakReference<Js::DynamicObject> *pRVar10;
  Type *pTVar11;
  long lVar12;
  ulong uVar13;
  PropertyRecord *propertyKey;
  byte bVar14;
  char *instance_00;
  DynamicType *newType;
  ulong uVar15;
  undefined1 local_b0 [8];
  TrackAllocData data;
  PropertyRecord *local_70;
  undefined4 extraout_var_00;
  
  iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])();
  if (CONCAT44(extraout_var,iVar7) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x64e,"(CanConvertToSimpleDictionaryType())",
                                "CanConvertToSimpleDictionaryType()");
    if (!bVar4) goto LAB_00dcc6cc;
    *puVar8 = 0;
  }
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x64f,"(instance)","instance");
    if (!bVar4) goto LAB_00dcc6cc;
    *puVar8 = 0;
  }
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = scriptContext->recycler;
  (*(instance->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x68])(instance);
  bVar4 = DynamicObject::DeoptimizeObjectHeaderInlining(instance);
  this_01 = this;
  if (bVar4) {
    pDVar9 = DynamicObject::GetTypeHandler(instance);
    iVar7 = (*pDVar9->_vptr_DynamicTypeHandler[0x4e])(pDVar9);
    if (iVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x660,"(instance->GetTypeHandler()->IsPathTypeHandler())",
                                  "instance->GetTypeHandler()->IsPathTypeHandler()");
      if (!bVar4) goto LAB_00dcc6cc;
      *puVar8 = 0;
    }
    this_01 = (PathTypeHandlerBase *)DynamicObject::GetTypeHandler(instance);
    if (this_01 == (PathTypeHandlerBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x668,"(oldTypeHandler)","oldTypeHandler");
      if (!bVar4) goto LAB_00dcc6cc;
      *puVar8 = 0;
      this_01 = (PathTypeHandlerBase *)0x0;
    }
  }
  oldType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  local_b0 = (undefined1  [8])
             &SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
              typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9d226db;
  data.filename._0_4_ = 0x66d;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_b0);
  this_02 = (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *)
            new<Memory::Recycler>(0x30,alloc,0x387914);
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
  SimpleDictionaryTypeHandlerBase
            (this_02,this_00,(this_01->super_DynamicTypeHandler).slotCapacity,propertyCapacity,
             (this_01->super_DynamicTypeHandler).inlineSlotCapacity,
             (this_01->super_DynamicTypeHandler).offsetOfInlineSlots,false,false);
  bVar5 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this_02);
  if ((bVar5 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x66f,"(newTypeHandler->GetHasOnlyWritableDataProperties())",
                                "newTypeHandler->GetHasOnlyWritableDataProperties()");
    if (!bVar4) goto LAB_00dcc6cc;
    *puVar8 = 0;
  }
  bVar4 = HasSingletonInstance(this_01);
  if (bVar4) {
    oldSingletonInstanceBefore = (((this_01->typePath).ptr)->singletonInstance).ptr;
  }
  else {
    oldSingletonInstanceBefore = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
  }
  TraceFixedFieldsBeforeTypeHandlerChange
            (L"converting",L"PathTypeHandler",L"SimpleDictionaryTypeHandler",instance,
             &this_01->super_DynamicTypeHandler,oldType,oldSingletonInstanceBefore);
  bVar4 = DynamicTypeHandler::CanBeSingletonInstance(instance);
  if (bVar4) {
    if (!mayBecomeShared) {
      bVar6 = DynamicTypeHandler::ShouldFixAnyProperties();
      if ((!bVar6) &&
         ((((this_01->typePath).ptr)->singletonInstance).ptr !=
          (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0x6c0,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                    "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
        if (!bVar6) goto LAB_00dcc6cc;
        *puVar8 = 0;
      }
      bVar6 = DynamicTypeHandler::ShouldFixAnyProperties();
      if (bVar6) {
        pRVar10 = (((this_01->typePath).ptr)->singletonInstance).ptr;
        if ((pRVar10 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
           ((DynamicObject *)(pRVar10->super_RecyclerWeakReferenceBase).strongRef != instance)) {
          pRVar10 = DynamicObject::CreateWeakReferenceToSelf(instance);
        }
        DynamicTypeHandler::SetSingletonInstance((DynamicTypeHandler *)this_02,pRVar10);
      }
    }
  }
  else {
    bVar6 = HasSingletonInstance(this_01);
    if (bVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x6ba,
                                  "(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance())"
                                  ,
                                  "canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance()"
                                 );
      if (!bVar6) goto LAB_00dcc6cc;
      *puVar8 = 0;
    }
  }
  if ((DAT_015bf345 == 1) && (((this_01->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x6d5,
                                "(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar6) goto LAB_00dcc6cc;
    *puVar8 = 0;
  }
  pTVar11 = (instance->super_RecyclableObject).type.ptr;
  if (pTVar11->typeId == TypeIds_GlobalObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x6d9,"(instance->GetTypeId() != TypeIds_GlobalObject)",
                                "instance->GetTypeId() != TypeIds_GlobalObject");
    if (!bVar6) goto LAB_00dcc6cc;
    *puVar8 = 0;
    pTVar11 = (instance->super_RecyclableObject).type.ptr;
  }
  bVar5 = 1;
  if ((*(char *)&pTVar11[1].javascriptLibrary.ptr == '\x01') &&
     (bVar14 = (this_01->super_DynamicTypeHandler).flags, (bVar14 & 0x20) == 0)) {
    if ((bVar14 & 0x18) == 0) {
      bVar5 = 0;
    }
    else {
      bVar5 = DAT_015bf345 ^ 1;
    }
  }
  iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])();
  lVar12 = CONCAT44(extraout_var_00,iVar7);
  if (1 < (this_01->super_DynamicTypeHandler).unusedBytes) {
    uVar15 = 0;
    data._32_8_ = lVar12;
    do {
      pTVar2 = (this_01->typePath).ptr;
      uVar13 = (ulong)((pTVar2->data).ptr)->pathLength;
      if (DAT_015bf361 == '\x01') {
        if (uVar15 < uVar13) {
          local_70 = TypePath::GetPropertyIdUnchecked(pTVar2,(int)uVar15);
        }
        else {
          local_70 = (PropertyRecord *)0x0;
        }
        if (lVar12 == 0) {
          bVar14 = 7;
        }
        else {
          bVar14 = *(byte *)(lVar12 + uVar15) & 0xf;
        }
        bVar1 = ((pTVar2->data).ptr)->maxInitializedLength;
        if (!bVar4 || mayBecomeShared) {
          bVar6 = false;
        }
        else {
          bVar6 = TypePath::GetIsFixedFieldAt
                            (pTVar2,(PropertyIndex)uVar15,
                             (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
        }
        if (bVar5 == 0) {
          usedAsFixed = false;
        }
        else {
          usedAsFixed = TypePath::GetIsUsedFixedFieldAt
                                  (pTVar2,(PropertyIndex)uVar15,
                                   (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
        }
        SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
        Add<Js::PropertyRecord_const*>
                  ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *
                   )this_02,local_70,bVar14,uVar15 < bVar1,bVar6,usedAsFixed,scriptContext);
        lVar12 = data._32_8_;
      }
      else {
        if (uVar15 < uVar13) {
          propertyKey = TypePath::GetPropertyIdUnchecked(pTVar2,(int)uVar15);
        }
        else {
          propertyKey = (PropertyRecord *)0x0;
        }
        if (lVar12 == 0) {
          bVar14 = 7;
        }
        else {
          bVar14 = *(byte *)(lVar12 + uVar15) & 0xf;
        }
        SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
        Add<Js::PropertyRecord_const*>
                  ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *
                   )this_02,propertyKey,bVar14,true,false,false,scriptContext);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (this_01->super_DynamicTypeHandler).unusedBytes >> 1);
  }
  if (DAT_015bf361 != '\0') {
    bVar4 = DynamicTypeHandler::ShouldFixAnyProperties();
    if ((!bVar4) &&
       ((((this_01->typePath).ptr)->singletonInstance).ptr !=
        (RecyclerWeakReference<Js::DynamicObject> *)0x0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x6ff,"(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded())",
                                  "oldTypeHandler->HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar4) goto LAB_00dcc6cc;
      *puVar8 = 0;
    }
    pTVar2 = (this_01->typePath).ptr;
    pRVar10 = (pTVar2->singletonInstance).ptr;
    if ((pRVar10 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
       ((DynamicObject *)(pRVar10->super_RecyclerWeakReferenceBase).strongRef == instance)) {
      (pTVar2->singletonInstance).ptr = (RecyclerWeakReference<Js::DynamicObject> *)0x0;
    }
  }
  if (mayBecomeShared) {
    DynamicTypeHandler::SetFlags((DynamicTypeHandler *)this_02,'\f');
  }
  if ((DAT_015bf345 == 1) &&
     (bVar14 = (this_01->super_DynamicTypeHandler).flags,
     (bVar14 & 0x20) != 0 && (bVar14 & 0x18) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x709,
                                "(!DynamicTypeHandler::IsolatePrototypes() || !oldTypeHandler->GetIsOrMayBecomeShared() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!DynamicTypeHandler::IsolatePrototypes() || !oldTypeHandler->GetIsOrMayBecomeShared() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar4) goto LAB_00dcc6cc;
    *puVar8 = 0;
  }
  if (((this_02->super_DynamicTypeHandler).flags & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x70a,"((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "Why did we create a brand new type handler with a prototype flag set?"
                               );
    if (!bVar4) goto LAB_00dcc6cc;
    *puVar8 = 0;
  }
  DynamicTypeHandler::SetFlags
            ((DynamicTypeHandler *)this_02,(this_01->super_DynamicTypeHandler).flags & 0x20);
  if (((this_02->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x70f,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar4) goto LAB_00dcc6cc;
    *puVar8 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes(&this_01->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_02,0xb0,values);
  DynamicTypeHandler::SetInstanceTypeHandler((DynamicTypeHandler *)this_02,instance,true);
  instance_00 = (char *)this_02;
  bVar4 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
          HasSingletonInstance(this_02);
  if ((bVar4) &&
     (instance_00 = (char *)instance, bVar4 = DynamicObject::HasSharedType(instance), bVar4)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    instance_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
    ;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x714,
                                "(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType())"
                                ,
                                "!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType()"
                               );
    if (!bVar4) goto LAB_00dcc6cc;
    *puVar8 = 0;
  }
  newType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  if ((bVar5 == 0) &&
     ((newType == oldType || ((oldType->super_Type).typeId == TypeIds_GlobalObject)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    instance_00 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
    ;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x716,
                                "(transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject))"
                                ,
                                "transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject)"
                               );
    if (!bVar4) {
LAB_00dcc6cc:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
    newType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  }
  TraceFixedFieldsAfterTypeHandlerChange
            ((DynamicObject *)instance_00,&this_01->super_DynamicTypeHandler,
             (DynamicTypeHandler *)this_02,oldType,newType,oldSingletonInstanceBefore);
  scriptContext->convertPathToSimpleDictionaryCount =
       scriptContext->convertPathToSimpleDictionaryCount + 1;
  return this_02;
}

Assistant:

T* PathTypeHandlerBase::ConvertToSimpleDictionaryType(DynamicObject* instance, int propertyCapacity, bool mayBecomeShared)
    {
        Assert(CanConvertToSimpleDictionaryType());
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        instance->PrepareForConversionToNonPathType();

        // Ideally 'this' and oldTypeHandler->GetTypeHandler() should be same
        // But we can have calls from external DOM objects, which requests us to replace the type of the
        // object with a new type. And in such cases, this API gets called with oldTypeHandler and the
        // new type (obtained from the External DOM object)
        // We use the duplicated typeHandler, if we deOptimized the object successfully, else we retain the earlier
        // behavior of using 'this' pointer.

        PathTypeHandlerBase * oldTypeHandler = nullptr;

        if (instance->DeoptimizeObjectHeaderInlining())
        {
            Assert(instance->GetTypeHandler()->IsPathTypeHandler());
            oldTypeHandler = reinterpret_cast<PathTypeHandlerBase *>(instance->GetTypeHandler());
        }
        else
        {
            oldTypeHandler = this;
        }

        Assert(oldTypeHandler);

#if ENABLE_FIXED_FIELDS
        DynamicType* oldType = instance->GetDynamicType();
#endif
        T* newTypeHandler = RecyclerNew(recycler, T, recycler, oldTypeHandler->GetSlotCapacity(), propertyCapacity, oldTypeHandler->GetInlineSlotCapacity(), oldTypeHandler->GetOffsetOfInlineSlots());
        // We expect the new type handler to start off marked as having only writable data properties.
        Assert(newTypeHandler->GetHasOnlyWritableDataProperties());

        // Care must be taken to correctly set up fixed field bits whenever a type's handler is changed.  Exactly what needs to
        // be done depends on whether the current handler is shared, whether the new handler is shared, whether the current
        // handler has the prototype flag set, and even whether we take a type transition as part of the process.
        //
        // 1. Can we set fixed bits on new handler for the fields that are marked as fixed on current handler?
        //
        //    Yes, if the new type handler is not shared.  If the handler is not shared, we know that only this instance will
        //    ever use it.  Otherwise, a different instance could transition to the same type handler, but have different values
        //    for fields marked as fixed.
        //
        // 2. Can we set fixed bits on new handler even for the fields that are not marked as fixed on current handler?
        //
        //    Yes, if the new type handler is not shared and we take a type transition during conversion.  The first condition
        //    is required for the same reason as in point 1 above.  The type transition is needed to ensure that any store
        //    field fast paths for this instance get invalidated.  If they didn't, then the newly fixed field could get
        //    overwritten on the fast path without triggering necessary invalidation.
        //
        //    Note that it's desirable to mark additional fields as fixed (particularly when the instance becomes a prototype)
        //    to counteract the effect of false type sharing, which may unnecessarily turn off some fixed field bits.
        //
        // 3. Do we need to clear any fixed field bits on the old or new type handler?
        //
        //    Yes, we must clear fixed fields bits for properties that aren't also used as fixed, but only if both type handlers
        //    are shared and we don't isolate prototypes.  This is rather tricky and results from us pre-creating certain handlers
        //    even before any instances actually have values for all represented properties.  We must avoid the situation, in which
        //    one instance switched to a new type handler with some fixed field not yet used as fixed, and later the second
        //    instance follows the same handler evolution with the same field used as fixed.  Upon switching to the new handler
        //    the second instance would "forget" that the field was used as fixed and fail to invalidate when overwritten.
        //
        //    Example: Instance A with TH1 has a fixed method FOO, which has not been used as fixed yet.  Then instance B gets
        //    pre-created and lands on TH1 (and so far assumes FOO is fixed).  As B's pre-creation continues, it moves to TH2, but
        //    thus far FOO has not been used as fixed.  Now instance A becomes a prototype, and its method FOO is used in a hard-coded
        //    JIT sequence, thus marking it as used as fixed.  Instance A then transitions to TH2 and we lose track of FOO being used
        //    as fixed.  If FOO is then overwritten on A, the hard-coded JIT sequence does not get invalidated and continues to call
        //    the old method FOO.
        //
        // 4. Can we avoid setting used as fixed bits on new handler for fields marked as used as fixed on current handler?
        //
        //    Yes, if the current type handler doesn't have the prototype flag and current handler is not shared or new handler
        //    is not shared or we isolate prototypes, and we take a type transition as part of the conversion.
        //
        //    Type transition ensures that any field loads from the instance are invalidated (including
        //    any that may have hard-coded the fixed field's value).  Hence, if the fixed field on this instance were to be later
        //    overwritten it will not cause any functional issues.  On the other hand, field loads from prototype are not affected
        //    by the prototype object's type change.  Therefore, if this instance is a prototype we must carry the used as fixed
        //    bits forward to ensure that if we overwrite any fixed field we explicitly trigger invalidation.
        //
        //    Review: Actually, the comment below is overly conservative.  If the second instance that became a prototype
        //    followed the same type evolution path, it would have to have invalidated all fixed fields, so there should be no need
        //    to transfer used as fixed bits, unless the current instance is already a prototype.
        //    In addition, if current handler is shared and the new handler is shared, a different instance with the current handler
        //    may later become a prototype (if we don't isolate prototypes) and follow the same conversion to the new handler, even
        //    if the current instance is not a prototype.  Hence, the new type handler must retain the used as fixed bits, so that
        //    proper invalidation can be triggered later, if overwritten.
        //
        //    Note that this may lead to the new type handler with some fields not marked as fixed, but marked as used as fixed.
        //
        //    Note also that if we isolate prototypes, we guarantee that no prototype instance will share a type handler with any
        //    other instance.  Hence, the problem sequence above could not take place.
        //
        // 5. Do we need to invalidate JIT-ed code for any fields marked as used as fixed on current handler?
        //
        //    No.  With the rules above any necessary invalidation will be triggered when the value actually gets overwritten.
        //

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = oldTypeHandler->GetSingletonInstance();
        oldTypeHandler->TraceFixedFieldsBeforeTypeHandlerChange(_u("converting"), _u("PathTypeHandler"), _u("SimpleDictionaryTypeHandler"), instance, oldTypeHandler, oldType, oldSingletonInstance);
#endif

        bool const canBeSingletonInstance = DynamicTypeHandler::CanBeSingletonInstance(instance);
        // If this type had been installed on a stack instance it shouldn't have a singleton Instance
        Assert(canBeSingletonInstance || !oldTypeHandler->HasSingletonInstance());

        // Consider: It looks like we're delaying sharing of these type handlers until the second instance arrives, so we could
        // set the singleton here and zap it later.
        if (!mayBecomeShared && canBeSingletonInstance)
        {
            Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());
            if (DynamicTypeHandler::AreSingletonInstancesNeeded())
            {
                RecyclerWeakReference<DynamicObject>* curSingletonInstance = oldTypeHandler->GetTypePath()->GetSingletonInstance();
                if (curSingletonInstance != nullptr && curSingletonInstance->Get() == instance)
                {
                    newTypeHandler->SetSingletonInstance(curSingletonInstance);
                }
                else
                {
                    newTypeHandler->SetSingletonInstance(instance->CreateWeakReferenceToSelf());
                }
            }
        }

        // It would be nice to transfer fixed fields if the new type handler may become fixed later (but isn't yet).  This would allow
        // singleton instances to retain fixed fields.  It would require that when we do actually share the target type (when the second
        // instance arrives), we clear (and invalidate, if necessary) any fixed fields.  This may be a reasonable trade-off.
        bool transferIsFixed = !mayBecomeShared && canBeSingletonInstance;

        // If we are a prototype or may become a prototype we must transfer used as fixed bits.  See point 4 above.
        Assert(!DynamicTypeHandler::IsolatePrototypes() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        // For the global object we don't emit a type check before a hard-coded use of a fixed field.  Therefore a type transition isn't sufficient to
        // invalidate any used fixed fields, and we must continue tracking them on the new type handler.  The global object should never have a path
        // type handler.
        Assert(instance->GetTypeId() != TypeIds_GlobalObject);
        // If the type isn't locked, we may not change the type of the instance, and we must also track the used fixed fields on the new handler.
        bool transferUsedAsFixed = !instance->GetDynamicType()->GetIsLocked() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) != 0 || (oldTypeHandler->GetIsOrMayBecomeShared() && !DynamicTypeHandler::IsolatePrototypes()));
#endif

        // Consider: As noted in point 2 above, when converting to non-shared SimpleDictionaryTypeHandler we could be more aggressive
        // and mark every field as fixed, because we will always take a type transition.  We have to remember to respect the switches as
        // to which kinds of properties we should fix, and for that we need the values from the instance.  Even if the type handler
        // says the property is initialized, the current instance may not have a value for it.  Check for value != null.

        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        for (PropertyIndex i = 0; i < oldTypeHandler->GetPathLength(); i++)
        {
#if ENABLE_FIXED_FIELDS
            if (PathTypeHandlerBase::FixPropsOnPathTypes())
            {
                Js::TypePath * typePath = oldTypeHandler->GetTypePath();
                newTypeHandler->Add(typePath->GetPropertyId(i), attributes ? ObjectSlotAttributesToPropertyAttributes(attributes[i]) : PropertyDynamicTypeDefaults,
                    i < typePath->GetMaxInitializedLength(),
                    transferIsFixed && typePath->GetIsFixedFieldAt(i, GetPathLength()),
                    transferUsedAsFixed && typePath->GetIsUsedFixedFieldAt(i, GetPathLength()),
                    scriptContext);
            }
            else
#endif
            {
                newTypeHandler->Add(oldTypeHandler->GetTypePath()->GetPropertyId(i), attributes ? ObjectSlotAttributesToPropertyAttributes(attributes[i]) : PropertyDynamicTypeDefaults, true, false, false, scriptContext);
            }

            // No need to clear fixed fields not used as fixed, because we never convert during pre-creation of type handlers and we always
            // add properties in order they appear on the type path.  Hence, any existing fixed fields will be turned off by any other
            // instance following this type path.  See point 3 above.
        }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        // Clear the singleton from this handler regardless of mayBecomeShared, because this instance no longer uses this handler.
        if (PathTypeHandlerBase::FixPropsOnPathTypes())
        {
            Assert(oldTypeHandler->HasSingletonInstanceOnlyIfNeeded());
            oldTypeHandler->GetTypePath()->ClearSingletonInstanceIfSame(instance);
        }
#endif

        if (mayBecomeShared)
        {
            newTypeHandler->SetFlags(IsLockedFlag | MayBecomeSharedFlag);
        }

        Assert(!DynamicTypeHandler::IsolatePrototypes() || !oldTypeHandler->GetIsOrMayBecomeShared() || ((oldTypeHandler->GetFlags() & IsPrototypeFlag) == 0));
        AssertMsg((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, oldTypeHandler->GetFlags());

        // Any new type handler we expect to see here should have inline slot capacity locked.  If this were to change, we would need
        // to update our shrinking logic (see ShrinkSlotAndInlineSlotCapacity).
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, oldTypeHandler->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);

#if ENABLE_FIXED_FIELDS
        Assert(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType());
        // We assumed that we don't need to transfer used as fixed bits unless we are a prototype, which is only valid if we also changed the type.
        Assert(transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject));

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        PathTypeHandlerBase::TraceFixedFieldsAfterTypeHandlerChange(instance, oldTypeHandler, newTypeHandler, oldType, instance->GetDynamicType(), oldSingletonInstance);
#endif
#endif

#ifdef PROFILE_TYPES
        scriptContext->convertPathToSimpleDictionaryCount++;
#endif
        return newTypeHandler;
    }